

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

void __thiscall duckdb_shell::ShellState::ShowConfiguration(ShellState *this)

{
  bool bVar1;
  ulong uVar2;
  uint *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  ShellState *in_RDI;
  int w;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffb0;
  FILE *pFVar6;
  char *in_stack_ffffffffffffffb8;
  ShellState *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  this_00 = (ShellState *)in_RDI->out;
  bVar1 = ShellHasFlag(in_RDI,0x40);
  pcVar5 = "off";
  if (bVar1) {
    pcVar5 = "on";
  }
  fprintf((FILE *)this_00,"%12.12s: %s\n","echo",pcVar5);
  pcVar5 = "off";
  if ((in_RDI->showHeader & 1U) != 0) {
    pcVar5 = "on";
  }
  fprintf((FILE *)in_RDI->out,"%12.12s: %s\n","headers",pcVar5);
  fprintf((FILE *)in_RDI->out,"%12.12s: %s\n","mode",modeDescr[(int)in_RDI->mode]);
  fprintf((FILE *)in_RDI->out,"%12.12s: ","nullvalue");
  std::__cxx11::string::c_str();
  OutputCString(this_00,in_stack_ffffffffffffffb8);
  fprintf((FILE *)in_RDI->out,anon_var_dwarf_3e83f70 + 8);
  pFVar6 = (FILE *)in_RDI->out;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
  }
  else {
    pcVar5 = "stdout";
  }
  fprintf(pFVar6,"%12.12s: %s\n","output",pcVar5);
  fprintf((FILE *)in_RDI->out,"%12.12s: ","colseparator");
  std::__cxx11::string::c_str();
  OutputCString(this_00,pcVar5);
  fprintf((FILE *)in_RDI->out,anon_var_dwarf_3e83f70 + 8);
  fprintf((FILE *)in_RDI->out,"%12.12s: ","rowseparator");
  std::__cxx11::string::c_str();
  OutputCString(this_00,pcVar5);
  fprintf((FILE *)in_RDI->out,anon_var_dwarf_3e83f70 + 8);
  fprintf((FILE *)in_RDI->out,"%12.12s: ","width");
  local_10 = &in_RDI->colWidth;
  local_18._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_18);
    fprintf((FILE *)in_RDI->out,"%d ",(ulong)*puVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_18);
  }
  fprintf((FILE *)in_RDI->out,anon_var_dwarf_3e83f70 + 8);
  pFVar6 = (FILE *)in_RDI->out;
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar6,"%12.12s: %s\n","filename",uVar4);
  return;
}

Assistant:

void ShellState::ShowConfiguration() {
	utf8_printf(out, "%12.12s: %s\n", "echo", ShellHasFlag(SHFLG_Echo) ? "on" : "off");
	utf8_printf(out, "%12.12s: %s\n", "headers", showHeader ? "on" : "off");
	utf8_printf(out, "%12.12s: %s\n", "mode", modeDescr[int(mode)]);
	utf8_printf(out, "%12.12s: ", "nullvalue");
	OutputCString(nullValue.c_str());
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: %s\n", "output", !outfile.empty() ? outfile.c_str() : "stdout");
	utf8_printf(out, "%12.12s: ", "colseparator");
	OutputCString(colSeparator.c_str());
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: ", "rowseparator");
	OutputCString(rowSeparator.c_str());
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: ", "width");
	for (auto w : colWidth) {
		raw_printf(out, "%d ", w);
	}
	raw_printf(out, "\n");
	utf8_printf(out, "%12.12s: %s\n", "filename", zDbFilename.c_str());
}